

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::Environment::bind<tcu::Vector<int,2>>
          (Environment *this,Variable<tcu::Vector<int,_2>_> *variable,IVal *value)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  undefined8 *puVar6;
  SharedPtr<unsigned_char> local_50;
  key_type local_40;
  
  puVar6 = (undefined8 *)operator_new__(0x30);
  dVar1 = value->m_data[0].m_lo;
  dVar2 = value->m_data[0].m_hi;
  uVar3 = *(undefined8 *)(value->m_data + 1);
  dVar4 = value->m_data[1].m_lo;
  dVar5 = value->m_data[1].m_hi;
  *puVar6 = *(undefined8 *)value->m_data;
  puVar6[1] = dVar1;
  puVar6[2] = dVar2;
  puVar6[3] = uVar3;
  puVar6[4] = dVar4;
  puVar6[5] = dVar5;
  std::__cxx11::string::string((string *)&local_40,(string *)&variable->m_name);
  de::SharedPtr<unsigned_char>::SharedPtr<de::ArrayDeleter<unsigned_char>>(&local_50,puVar6);
  de::
  insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
            (&this->m_map,&local_40,&local_50);
  de::SharedPtr<unsigned_char>::release(&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void						bind	(const Variable<T>&					variable,
										 const typename Traits<T>::IVal&	value)
	{
		deUint8* const data = new deUint8[sizeof(value)];

		deMemcpy(data, &value, sizeof(value));
		de::insert(m_map, variable.getName(), SharedPtr<deUint8>(data, de::ArrayDeleter<deUint8>()));
	}